

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heter_queue.h
# Opt level: O2

bool __thiscall
density::
heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_()>,_density::basic_default_allocator<65536UL>_>
::empty(heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_()>,_density::basic_default_allocator<65536UL>_>
        *this)

{
  ControlBlock *pCVar1;
  ControlBlock *pCVar2;
  
  pCVar1 = this->m_head;
  do {
    pCVar2 = pCVar1;
    if (pCVar2 == this->m_tail) break;
    pCVar1 = (ControlBlock *)(pCVar2->m_next & 0xfffffffffffffff8);
  } while ((pCVar2->m_next & 3) != 0);
  return pCVar2 == this->m_tail;
}

Assistant:

bool empty() const noexcept
        {
            // the queue may contain busy or dead elements, that must be ignored
            for (auto curr = m_head; curr != m_tail;)
            {
                auto const control_bits = curr->m_next & (detail::Queue_Busy | detail::Queue_Dead);
                if (control_bits == 0) // if not busy and not dead
                {
                    return false;
                }
                curr = reinterpret_cast<ControlBlock *>(curr->m_next & ~detail::Queue_AllFlags);
            }
            return true;
        }